

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chemkinReader.cpp
# Opt level: O2

ssize_t __thiscall IO::ChemkinReader::read(ChemkinReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  TransportParser transportParser;
  ThermoParser thermoParser;
  string local_120;
  string local_100;
  TransportParser local_e0;
  ThermoParser local_a0;
  
  readGlobalUnits(this);
  readElements(this);
  readSpecies(this);
  std::__cxx11::string::string((string *)&local_100,(string *)&this->thermfile_);
  ThermoParser::ThermoParser(&local_a0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  ThermoParser::parse(&local_a0,&this->species_);
  bVar1 = std::operator!=(&this->transfile_,"NOT READ");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_120,(string *)&this->transfile_);
    TransportParser::TransportParser(&local_e0,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    TransportParser::parse(&local_e0,&this->species_);
    TransportParser::~TransportParser(&local_e0);
  }
  readReactions(this);
  ThermoParser::~ThermoParser(&local_a0);
  return CONCAT71(extraout_var,extraout_AL);
}

Assistant:

void IO::ChemkinReader::read()
{

    readGlobalUnits();

    readElements();
    readSpecies();

    ThermoParser thermoParser(thermfile_);
    thermoParser.parse(species_);

    if (transfile_ != "NOT READ")
    {
        TransportParser transportParser(transfile_);
        transportParser.parse(species_);
    }

    readReactions();

}